

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# woff2_compress.cc
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  char cVar3;
  long *plVar4;
  long *plVar5;
  int iVar6;
  uchar *puVar7;
  ulong uVar8;
  string outfilename;
  size_t output_size;
  string input;
  string output;
  string filename;
  WOFF2Params params;
  long *local_338;
  long local_328;
  long lStack_320;
  ulong local_318;
  uchar *local_310;
  ulong local_308;
  uchar local_300 [16];
  uchar *local_2f0;
  long local_2e8;
  uchar local_2e0 [16];
  undefined1 *local_2d0;
  long local_2c8;
  undefined1 local_2c0 [16];
  ostream_iterator<char,_char,_std::char_traits<char>_> local_2b0;
  char *local_2a0 [2];
  char local_290 [16];
  char *local_280 [2];
  char local_270 [16];
  WOFF2Params local_260;
  undefined1 *local_238;
  filebuf local_230 [8];
  undefined1 local_228 [232];
  ios_base local_140 [272];
  
  if (argc == 2) {
    std::__cxx11::string::string((string *)&local_2d0,argv[1],(allocator *)&local_238);
    std::__cxx11::string::find_last_of((char *)&local_2d0,0x103039,0xffffffffffffffff);
    std::__cxx11::string::substr((ulong)&local_238,(ulong)&local_2d0);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_238);
    local_338 = &local_328;
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_328 = *plVar5;
      lStack_320 = plVar4[3];
    }
    else {
      local_328 = *plVar5;
      local_338 = (long *)*plVar4;
    }
    lVar2 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if (local_238 != local_228) {
      operator_delete(local_238);
    }
    fprintf(_stdout,"Processing %s => %s\n",local_2d0,local_338);
    local_280[0] = local_270;
    std::__cxx11::string::_M_construct<char*>((string *)local_280,local_2d0,local_2d0 + local_2c8);
    std::ifstream::ifstream(&local_238,local_280[0],_S_bin);
    local_310 = local_300;
    std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)&local_310,local_228,0xffffffff,0,0xffffffff);
    std::ifstream::~ifstream(&local_238);
    if (local_280[0] != local_270) {
      operator_delete(local_280[0]);
    }
    puVar7 = local_310;
    local_318 = woff2::MaxWOFF2CompressedSize(local_310,local_308);
    local_2f0 = local_2e0;
    std::__cxx11::string::_M_construct((ulong)&local_2f0,(char)local_318);
    paVar1 = &local_260.extended_metadata.field_2;
    local_260.extended_metadata._M_string_length = 0;
    local_260.extended_metadata.field_2._M_local_buf[0] = '\0';
    local_260.brotli_quality = 0xb;
    local_260.allow_transforms = true;
    local_260.extended_metadata._M_dataplus._M_p = (pointer)paVar1;
    cVar3 = woff2::ConvertTTFToWOFF2(puVar7,local_308,local_2f0,&local_318,&local_260);
    if (cVar3 == '\0') {
      main_cold_2();
      iVar6 = 1;
    }
    else {
      std::__cxx11::string::resize((ulong)&local_2f0,(char)local_318);
      local_2a0[0] = local_290;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2a0,local_338,lVar2 + (long)local_338);
      puVar7 = local_2f0;
      std::ofstream::ofstream((ostream_type *)&local_238,local_2a0[0],_S_bin);
      local_2b0._M_string = (char *)0x0;
      local_2b0._M_stream = (ostream_type *)&local_238;
      if (0 < local_2e8) {
        uVar8 = local_2e8 + 1;
        do {
          std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
                    (&local_2b0,(char *)puVar7);
          puVar7 = puVar7 + 1;
          uVar8 = uVar8 - 1;
        } while (1 < uVar8);
      }
      local_238 = _VTT;
      *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18) + -8) = _operator_delete;
      std::filebuf::~filebuf(local_230);
      std::ios_base::~ios_base(local_140);
      iVar6 = 0;
      if (local_2a0[0] != local_290) {
        operator_delete(local_2a0[0]);
        iVar6 = 0;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260.extended_metadata._M_dataplus._M_p != paVar1) {
      operator_delete(local_260.extended_metadata._M_dataplus._M_p);
    }
    if (local_2f0 != local_2e0) {
      operator_delete(local_2f0);
    }
    if (local_310 != local_300) {
      operator_delete(local_310);
    }
    if (local_338 != &local_328) {
      operator_delete(local_338);
    }
    if (local_2d0 != local_2c0) {
      operator_delete(local_2d0);
    }
  }
  else {
    main_cold_1();
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

int main(int argc, char **argv) {
  using std::string;

  if (argc != 2) {
    fprintf(stderr, "One argument, the input filename, must be provided.\n");
    return 1;
  }

  string filename(argv[1]);
  string outfilename = filename.substr(0, filename.find_last_of(".")) + ".woff2";
  fprintf(stdout, "Processing %s => %s\n",
    filename.c_str(), outfilename.c_str());
  string input = woff2::GetFileContent(filename);

  const uint8_t* input_data = reinterpret_cast<const uint8_t*>(input.data());
  size_t output_size = woff2::MaxWOFF2CompressedSize(input_data, input.size());
  string output(output_size, 0);
  uint8_t* output_data = reinterpret_cast<uint8_t*>(&output[0]);

  woff2::WOFF2Params params;
  if (!woff2::ConvertTTFToWOFF2(input_data, input.size(),
                                output_data, &output_size, params)) {
    fprintf(stderr, "Compression failed.\n");
    return 1;
  }
  output.resize(output_size);

  woff2::SetFileContents(outfilename, output.begin(), output.end());

  return 0;
}